

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::IGXMLScanner::parseSchemaLocation
          (IGXMLScanner *this,XMLCh *schemaLocationStr,bool ignoreLoadSchema)

{
  short *psVar1;
  ulong uVar2;
  XMLCh *loc;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char16_t **ppcVar4;
  MemoryManager *pMVar5;
  size_t __n;
  XMLSize_t getAt;
  XMLBuffer normalBuf;
  ArrayJanitor<char16_t> janLoc;
  XMLBuffer local_78;
  ArrayJanitor<char16_t> local_40;
  char16_t *toDelete;
  
  pMVar5 = (this->super_XMLScanner).fMemoryManager;
  if (schemaLocationStr == (XMLCh *)0x0) {
    toDelete = (char16_t *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)schemaLocationStr + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar3 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,__n);
    toDelete = (char16_t *)CONCAT44(extraout_var,iVar3);
    memcpy(toDelete,schemaLocationStr,__n);
    pMVar5 = (this->super_XMLScanner).fMemoryManager;
  }
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,pMVar5);
  processSchemaLocation(this,toDelete);
  uVar2 = this->fLocationPairs->fCurCount;
  if ((uVar2 & 1) == 0) {
    pMVar5 = (this->super_XMLScanner).fMemoryManager;
    local_78.fIndex = 0;
    local_78.fCapacity = 0x3ff;
    local_78.fFullSize = 0;
    local_78.fUsed = false;
    local_78.fFullHandler = (XMLBufferFullHandler *)0x0;
    local_78.fMemoryManager = pMVar5;
    iVar3 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,0x800);
    local_78.fBuffer = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
    *local_78.fBuffer = L'\0';
    if (uVar2 != 0) {
      getAt = 0;
      do {
        ppcVar4 = ValueVectorOf<char16_t_*>::elementAt(this->fLocationPairs,getAt);
        normalizeAttRawValue(this,L"schemaLocation",*ppcVar4,&local_78);
        ppcVar4 = ValueVectorOf<char16_t_*>::elementAt(this->fLocationPairs,getAt + 1);
        loc = *ppcVar4;
        local_78.fBuffer[local_78.fIndex] = L'\0';
        resolveSchemaGrammar(this,loc,local_78.fBuffer,ignoreLoadSchema);
        getAt = getAt + 2;
        pMVar5 = local_78.fMemoryManager;
      } while (getAt < uVar2);
    }
    (*pMVar5->_vptr_MemoryManager[4])(pMVar5,local_78.fBuffer);
  }
  else {
    XMLScanner::emitError(&this->super_XMLScanner,BadSchemaLocation);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  return;
}

Assistant:

void IGXMLScanner::parseSchemaLocation(const XMLCh* const schemaLocationStr, bool ignoreLoadSchema)
{
    XMLCh* locStr = XMLString::replicate(schemaLocationStr, fMemoryManager);
    ArrayJanitor<XMLCh> janLoc(locStr, fMemoryManager);

    processSchemaLocation(locStr);
    XMLSize_t size = fLocationPairs->size();

    if (size % 2 != 0 ) {
        emitError(XMLErrs::BadSchemaLocation);
    } else {
        // We need a buffer to normalize the attribute value into
        XMLBuffer normalBuf(1023, fMemoryManager);
        for(XMLSize_t i=0; i<size; i=i+2) {
            normalizeAttRawValue(SchemaSymbols::fgXSI_SCHEMALOCATION, fLocationPairs->elementAt(i), normalBuf);
            resolveSchemaGrammar(fLocationPairs->elementAt(i+1), normalBuf.getRawBuffer(), ignoreLoadSchema);
        }
    }
}